

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMux.c
# Opt level: O0

If_Obj_t * Lpk_MapSuppRedDec_rec(Lpk_Man_t *p,uint *pTruth,int nVars,If_Obj_t **ppLeaves)

{
  Kit_DsdNtk_t *pNtk;
  Kit_DsdNtk_t *pNtk_00;
  If_Obj_t *pIVar1;
  byte bVar2;
  int local_f0;
  int local_ec;
  int i;
  int iVarReused;
  int iVar;
  int uSubset1;
  int uSubset0;
  int uSubsets;
  int FalseMint1;
  int FalseMint0;
  int TrueMint1;
  int TrueMint0;
  uint *pCo;
  uint *pCo1;
  uint *pCo0;
  uint *pCo11;
  uint *pCo10;
  uint *pCo01;
  uint *pCo00;
  uint *pDec;
  uint *pDec1;
  uint *pDec0;
  uint *pCof1;
  uint *pCof0;
  If_Obj_t *pObjNew;
  Kit_DsdNtk_t *pTemp;
  Kit_DsdNtk_t *ppNtks [2];
  Kit_DsdNtk_t *pNtkComp;
  Kit_DsdNtk_t *pNtkDec;
  If_Obj_t **ppLeaves_local;
  int nVars_local;
  uint *pTruth_local;
  Lpk_Man_t *p_local;
  
  pCof1 = (uint *)Vec_PtrEntry(p->vTtNodes,0);
  pDec0 = (uint *)Vec_PtrEntry(p->vTtNodes,1);
  pDec1 = (uint *)Vec_PtrEntry(p->vTtNodes,2);
  pDec = (uint *)Vec_PtrEntry(p->vTtNodes,3);
  pCo00 = (uint *)Vec_PtrEntry(p->vTtNodes,4);
  pCo01 = (uint *)Vec_PtrEntry(p->vTtNodes,5);
  pCo10 = (uint *)Vec_PtrEntry(p->vTtNodes,6);
  pCo11 = (uint *)Vec_PtrEntry(p->vTtNodes,7);
  pCo0 = (uint *)Vec_PtrEntry(p->vTtNodes,8);
  pCo1 = (uint *)Vec_PtrEntry(p->vTtNodes,9);
  pCo = (uint *)Vec_PtrEntry(p->vTtNodes,10);
  _TrueMint1 = (uint *)Vec_PtrEntry(p->vTtNodes,0xb);
  uSubset1 = Lpk_MapSuppRedDecSelect(p,pTruth,nVars,&i,&local_ec);
  if (uSubset1 == 0) {
    p_local = (Lpk_Man_t *)0x0;
  }
  else {
    p->nCalledSRed = p->nCalledSRed + 1;
    Kit_TruthCofactor0New(pCof1,pTruth,nVars,i);
    Kit_TruthCofactor1New(pDec0,pTruth,nVars,i);
    iVar = uSubset1 & 0xffff;
    iVarReused = uSubset1 >> 0x10;
    pTemp = Kit_DsdDecompose(pCof1,nVars);
    ppNtks[0] = Kit_DsdDecompose(pDec0,nVars);
    pObjNew = (If_Obj_t *)pTemp;
    pTemp = Kit_DsdExpand(pTemp);
    Kit_DsdNtkFree((Kit_DsdNtk_t *)pObjNew);
    pObjNew = (If_Obj_t *)ppNtks[0];
    ppNtks[0] = Kit_DsdExpand(ppNtks[0]);
    Kit_DsdNtkFree((Kit_DsdNtk_t *)pObjNew);
    Kit_DsdTruthPartial(p->pDsdMan,pTemp,pDec1,iVar);
    Kit_DsdTruthPartial(p->pDsdMan,ppNtks[0],pDec,iVarReused);
    Kit_DsdNtkFree(pTemp);
    Kit_DsdNtkFree(ppNtks[0]);
    Kit_TruthMuxVar(pCo00,pDec1,pDec,nVars,i);
    FalseMint0 = Kit_TruthFindFirstBit(pDec1,nVars);
    FalseMint1 = Kit_TruthFindFirstBit(pDec,nVars);
    if ((FalseMint0 < 0) || (FalseMint1 < 0)) {
      __assert_fail("TrueMint0 >= 0 && TrueMint1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMux.c"
                    ,0xb9,
                    "If_Obj_t *Lpk_MapSuppRedDec_rec(Lpk_Man_t *, unsigned int *, int, If_Obj_t **)"
                   );
    }
    uSubsets = Kit_TruthFindFirstZero(pDec1,nVars);
    uSubset0 = Kit_TruthFindFirstZero(pDec,nVars);
    if ((uSubsets < 0) || (uSubset0 < 0)) {
      __assert_fail("FalseMint0 >= 0 && FalseMint1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMux.c"
                    ,0xbd,
                    "If_Obj_t *Lpk_MapSuppRedDec_rec(Lpk_Man_t *, unsigned int *, int, If_Obj_t **)"
                   );
    }
    Kit_TruthCopy(pCo01,pCof1,nVars);
    Kit_TruthCopy(pCo10,pCof1,nVars);
    for (local_f0 = 0; local_f0 < nVars; local_f0 = local_f0 + 1) {
      bVar2 = (byte)local_f0;
      if ((iVar & 1 << (bVar2 & 0x1f)) != 0) {
        if ((uSubsets & 1 << (bVar2 & 0x1f)) == 0) {
          Kit_TruthCofactor0(pCo01,nVars,local_f0);
        }
        else {
          Kit_TruthCofactor1(pCo01,nVars,local_f0);
        }
        if ((FalseMint0 & 1 << (bVar2 & 0x1f)) == 0) {
          Kit_TruthCofactor0(pCo10,nVars,local_f0);
        }
        else {
          Kit_TruthCofactor1(pCo10,nVars,local_f0);
        }
      }
    }
    Kit_TruthCopy(pCo11,pDec0,nVars);
    Kit_TruthCopy(pCo0,pDec0,nVars);
    for (local_f0 = 0; local_f0 < nVars; local_f0 = local_f0 + 1) {
      bVar2 = (byte)local_f0;
      if ((iVarReused & 1 << (bVar2 & 0x1f)) != 0) {
        if ((uSubset0 & 1 << (bVar2 & 0x1f)) == 0) {
          Kit_TruthCofactor0(pCo11,nVars,local_f0);
        }
        else {
          Kit_TruthCofactor1(pCo11,nVars,local_f0);
        }
        if ((FalseMint1 & 1 << (bVar2 & 0x1f)) == 0) {
          Kit_TruthCofactor0(pCo0,nVars,local_f0);
        }
        else {
          Kit_TruthCofactor1(pCo0,nVars,local_f0);
        }
      }
    }
    Kit_TruthMuxVar(pCo1,pCo01,pCo10,nVars,local_ec);
    Kit_TruthMuxVar(pCo,pCo11,pCo0,nVars,local_ec);
    Kit_TruthMuxVar(_TrueMint1,pCo1,pCo,nVars,i);
    pNtk = Kit_DsdDecompose(pCo00,nVars);
    pNtk_00 = Kit_DsdDecompose(_TrueMint1,nVars);
    pIVar1 = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)pNtk->Root,(If_Obj_t *)0x0);
    ppLeaves[local_ec] = pIVar1;
    pCof0 = (uint *)Lpk_MapTree_rec(p,pNtk_00,ppLeaves,(uint)pNtk_00->Root,(If_Obj_t *)0x0);
    Kit_DsdNtkFree(pNtk);
    Kit_DsdNtkFree(pNtk_00);
    p_local = (Lpk_Man_t *)pCof0;
  }
  return (If_Obj_t *)p_local;
}

Assistant:

If_Obj_t * Lpk_MapSuppRedDec_rec( Lpk_Man_t * p, unsigned * pTruth, int nVars, If_Obj_t ** ppLeaves )
{
    Kit_DsdNtk_t * pNtkDec, * pNtkComp, * ppNtks[2], * pTemp;
    If_Obj_t * pObjNew;
    unsigned * pCof0 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  0 );
    unsigned * pCof1 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  1 );
    unsigned * pDec0 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  2 );
    unsigned * pDec1 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  3 );
    unsigned * pDec  = (unsigned *)Vec_PtrEntry( p->vTtNodes,  4 );
    unsigned * pCo00 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  5 );
    unsigned * pCo01 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  6 );
    unsigned * pCo10 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  7 );
    unsigned * pCo11 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  8 );
    unsigned * pCo0  = (unsigned *)Vec_PtrEntry( p->vTtNodes,  9 );
    unsigned * pCo1  = (unsigned *)Vec_PtrEntry( p->vTtNodes, 10 );
    unsigned * pCo   = (unsigned *)Vec_PtrEntry( p->vTtNodes, 11 );
    int TrueMint0, TrueMint1, FalseMint0, FalseMint1;
    int uSubsets, uSubset0, uSubset1, iVar, iVarReused, i;

    // determine if supp-red decomposition exists
    uSubsets = Lpk_MapSuppRedDecSelect( p, pTruth, nVars, &iVar, &iVarReused );
    if ( uSubsets == 0 )
        return NULL;
    p->nCalledSRed++;

    // get the cofactors
    Kit_TruthCofactor0New( pCof0, pTruth, nVars, iVar );
    Kit_TruthCofactor1New( pCof1, pTruth, nVars, iVar );

    // get the bound sets
    uSubset0 = uSubsets & 0xFFFF;
    uSubset1 = uSubsets >> 16;

    // compute the decomposed functions
    ppNtks[0] = Kit_DsdDecompose( pCof0, nVars );
    ppNtks[1] = Kit_DsdDecompose( pCof1, nVars );
    ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );      Kit_DsdNtkFree( pTemp );
    ppNtks[1] = Kit_DsdExpand( pTemp = ppNtks[1] );      Kit_DsdNtkFree( pTemp );
    Kit_DsdTruthPartial( p->pDsdMan, ppNtks[0], pDec0, uSubset0 );
    Kit_DsdTruthPartial( p->pDsdMan, ppNtks[1], pDec1, uSubset1 );
//    Kit_DsdTruthPartialTwo( p->pDsdMan, ppNtks[0], uSubset0, iVarReused, pCo0, pDec0 );
//    Kit_DsdTruthPartialTwo( p->pDsdMan, ppNtks[1], uSubset1, iVarReused, pCo1, pDec1 );
    Kit_DsdNtkFree( ppNtks[0] );
    Kit_DsdNtkFree( ppNtks[1] );
//Kit_DsdPrintFromTruth( pDec0, nVars );
//Kit_DsdPrintFromTruth( pDec1, nVars );
    // get the decomposed function
    Kit_TruthMuxVar( pDec, pDec0, pDec1, nVars, iVar );

    // find any true assignments of the decomposed functions
    TrueMint0 = Kit_TruthFindFirstBit( pDec0, nVars );
    TrueMint1 = Kit_TruthFindFirstBit( pDec1, nVars );
    assert( TrueMint0 >= 0 && TrueMint1 >= 0 );
    // find any false assignments of the decomposed functions
    FalseMint0 = Kit_TruthFindFirstZero( pDec0, nVars );
    FalseMint1 = Kit_TruthFindFirstZero( pDec1, nVars );
    assert( FalseMint0 >= 0 && FalseMint1 >= 0 );

    // cofactor the cofactors according to these minterms
    Kit_TruthCopy( pCo00, pCof0, nVars );
    Kit_TruthCopy( pCo01, pCof0, nVars );
    for ( i = 0; i < nVars; i++ )
        if ( uSubset0 & (1 << i) )
        {
            if ( FalseMint0 & (1 << i) )
                Kit_TruthCofactor1( pCo00, nVars, i );
            else
                Kit_TruthCofactor0( pCo00, nVars, i );
            if ( TrueMint0 & (1 << i) )
                Kit_TruthCofactor1( pCo01, nVars, i );
            else
                Kit_TruthCofactor0( pCo01, nVars, i );
        }
    Kit_TruthCopy( pCo10, pCof1, nVars );
    Kit_TruthCopy( pCo11, pCof1, nVars );
    for ( i = 0; i < nVars; i++ )
        if ( uSubset1 & (1 << i) )
        {
            if ( FalseMint1 & (1 << i) )
                Kit_TruthCofactor1( pCo10, nVars, i );
            else
                Kit_TruthCofactor0( pCo10, nVars, i );
            if ( TrueMint1 & (1 << i) )
                Kit_TruthCofactor1( pCo11, nVars, i );
            else
                Kit_TruthCofactor0( pCo11, nVars, i );
        }

    // derive the functions by composing them with the new variable (iVarReused)
    Kit_TruthMuxVar( pCo0, pCo00, pCo01, nVars, iVarReused );
    Kit_TruthMuxVar( pCo1, pCo10, pCo11, nVars, iVarReused );
//Kit_DsdPrintFromTruth( pCo0, nVars );
//Kit_DsdPrintFromTruth( pCo1, nVars );

    // derive the composition function
    Kit_TruthMuxVar( pCo , pCo0 , pCo1 , nVars, iVar );

    // process the decomposed function
    pNtkDec = Kit_DsdDecompose( pDec, nVars );
    pNtkComp = Kit_DsdDecompose( pCo, nVars );
//Kit_DsdPrint( stdout, pNtkDec );
//Kit_DsdPrint( stdout, pNtkComp );
//printf( "cofactored variable %c\n", 'a' + iVar );
//printf( "reused variable %c\n", 'a' + iVarReused );

    ppLeaves[iVarReused] = Lpk_MapTree_rec( p, pNtkDec, ppLeaves, pNtkDec->Root, NULL );
    pObjNew = Lpk_MapTree_rec( p, pNtkComp, ppLeaves, pNtkComp->Root, NULL );

    Kit_DsdNtkFree( pNtkDec );
    Kit_DsdNtkFree( pNtkComp );
    return pObjNew;
}